

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tag.cpp
# Opt level: O0

void __thiscall Tag::~Tag(Tag *this)

{
  StreamObject *this_00;
  size_type sVar1;
  reference ppSVar2;
  uint local_14;
  uint i;
  Tag *this_local;
  
  (this->super_StreamObject)._vptr_StreamObject = (_func_int **)&PTR_write_00111b68;
  local_14 = 0;
  while( true ) {
    sVar1 = std::vector<StreamObject_*,_std::allocator<StreamObject_*>_>::size
                      (&this->_streamObjects);
    if (sVar1 <= local_14) break;
    ppSVar2 = std::vector<StreamObject_*,_std::allocator<StreamObject_*>_>::operator[]
                        (&this->_streamObjects,(ulong)local_14);
    if (*ppSVar2 != (value_type)0x0) {
      ppSVar2 = std::vector<StreamObject_*,_std::allocator<StreamObject_*>_>::operator[]
                          (&this->_streamObjects,(ulong)local_14);
      this_00 = *ppSVar2;
      if (this_00 != (StreamObject *)0x0) {
        StreamObject::~StreamObject(this_00);
        operator_delete(this_00,0x40);
      }
      ppSVar2 = std::vector<StreamObject_*,_std::allocator<StreamObject_*>_>::operator[]
                          (&this->_streamObjects,(ulong)local_14);
      *ppSVar2 = (value_type)0x0;
    }
    local_14 = local_14 + 1;
  }
  std::vector<StreamObject_*,_std::allocator<StreamObject_*>_>::~vector(&this->_streamObjects);
  StreamObject::~StreamObject(&this->super_StreamObject);
  return;
}

Assistant:

Tag::~Tag()
{
	//std::cout << __PRETTY_FUNCTION__ << std::endl;

	for ( unsigned int i = 0; i < _streamObjects.size();i++ )
	{
		if ( _streamObjects[i] != NULL )
		{
			delete _streamObjects[i];
			_streamObjects[i] = NULL;
		}
	}
}